

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall
HashUtil_Sha512Bytes_Test::~HashUtil_Sha512Bytes_Test(HashUtil_Sha512Bytes_Test *this)

{
  HashUtil_Sha512Bytes_Test *this_local;
  
  ~HashUtil_Sha512Bytes_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(HashUtil, Sha512Bytes) {
  std::vector<uint8_t> target;
  target.push_back(0x01);
  target.push_back(0x02);
  target.push_back(0x03);
  ByteData byte_data = HashUtil::Sha512(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "27864cc5219a951a7a6e52b8c8dddf6981d098da1658d96258c870b2c88dfbcb51841aea172a28bafa6a79731165584677066045c959ed0f9929688d04defc29");
}